

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_ae763::EdgeClippingLayer::Build(EdgeClippingLayer *this,Graph *g,S2Error *error)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> *input_ids;
  pointer puVar4;
  __uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> _Var5;
  double dVar6;
  CrossingInputEdge *pCVar7;
  CrossingInputEdge CVar8;
  vector<signed_char,_std::allocator<signed_char>_> *pvVar9;
  InputEdgeCrossings *pIVar10;
  undefined8 uVar11;
  pointer pIVar12;
  SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *pSVar13;
  byte bVar14;
  bool bVar15;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var16;
  CrossingInputEdge *pCVar17;
  pointer pCVar18;
  ulong uVar19;
  pointer pIVar20;
  undefined8 *puVar21;
  ostream *poVar22;
  const_reference pCVar23;
  long lVar24;
  int iVar25;
  CrossingInputEdge CVar26;
  ulong uVar27;
  pointer piVar28;
  uint uVar29;
  Rep *pRVar30;
  int iVar31;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *__cur;
  int *piVar32;
  pointer pIVar33;
  GraphOptions *options;
  CrossingInputEdge CVar34;
  CrossingGraphEdgeVector *__range1;
  pointer pCVar35;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *pIVar36;
  long lVar37;
  Edge edge;
  Edge edge_00;
  Edge edge_01;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  long lVar41;
  Edge *__x;
  int i_3;
  InputEdgeId input_edge_id;
  ulong uVar42;
  int i_4;
  pointer pIVar43;
  long lVar44;
  CrossingInputEdge CVar45;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *__cur_1;
  CrossingInputEdge *pCVar46;
  CrossingInputEdge *pCVar47;
  pointer piVar48;
  Rep *pRVar49;
  _Vector_base<int,_std::allocator<int>_> *this_00;
  int i_2;
  uint uVar50;
  ulong uVar51;
  long lVar52;
  undefined8 *puVar53;
  bool bVar54;
  double dVar55;
  reference rVar56;
  int local_36c;
  int local_344;
  ulong local_340;
  vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
  b_input_edges;
  vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
  b_edges;
  vector<int,_std::allocator<int>_> a_vertices;
  vector<int,_std::allocator<int>_> indegree;
  undefined1 local_248 [48];
  pointer local_218;
  SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *local_210;
  ulong local_208;
  int local_200;
  int local_1fc;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> vmap;
  _Function_base local_1b0;
  char *local_188;
  Graph *local_180;
  vector<int,_std::allocator<int>_> *local_178;
  long local_170;
  long local_168;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *local_160;
  ulong local_158;
  long local_150;
  IdSetLexicon new_input_edge_id_set_lexicon;
  vector<int,_std::allocator<int>_> a_num_crossings;
  reference local_40;
  
  local_248._16_8_ = (pointer)0x0;
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_218 = (pointer)0x0;
  local_248._32_8_ = (pointer)0x0;
  local_248._40_8_ = (pointer)0x0;
  pvVar9 = this->input_dimensions_;
  pIVar10 = this->input_crossings_;
  new_input_edge_id_set_lexicon.id_sets_.values_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)g;
  S2Builder::Graph::VertexInMap::VertexInMap
            ((VertexInMap *)
             &new_input_edge_id_set_lexicon.id_sets_.values_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish,g);
  S2Builder::Graph::VertexOutMap::VertexOutMap
            ((VertexOutMap *)
             ((long)&new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.settings.
                     super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
                     .super_IdHasher + 8),g);
  piVar28 = new_input_edge_id_set_lexicon.id_sets_.values_.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.key_info.super_IdKeyEqual.lexicon_ =
       (SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *)local_248;
  new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.key_info._16_8_ = local_248 + 0x20;
  input_ids = g->input_edge_id_set_ids_;
  new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.settings.
  super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
  ._40_8_ = pvVar9;
  new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.key_info.super_IdKeyEqual._0_8_ = pIVar10;
  new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_deleted = (size_type)input_ids;
  if (*new_input_edge_id_set_lexicon.id_sets_.values_.super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_start == 0) {
    if (new_input_edge_id_set_lexicon.id_sets_.values_.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_start[2] == 1) {
      if (new_input_edge_id_set_lexicon.id_sets_.values_.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[3]
          == 2) {
        S2Builder::Graph::GetInputEdgeOrder
                  ((vector<int,_std::allocator<int>_> *)
                   &new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_elements,
                   (Graph *)new_input_edge_id_set_lexicon.id_sets_.values_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,input_ids);
        vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::vector
                  (&indegree,(long)piVar28[5],(allocator_type *)&a_vertices);
        uVar40 = 0;
        local_210 = (SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *)error;
        local_180 = g;
LAB_001e83dc:
        uVar27 = (long)(new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_buckets -
                       new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_elements) >> 2;
        while( true ) {
          uVar50 = (uint)uVar40;
          uVar42 = (ulong)(int)uVar50;
          if (uVar27 <= uVar42) break;
          piVar48 = (input_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar51 = uVar42;
          while ((uVar40 = uVar27, uVar27 != uVar51 &&
                 (uVar40 = uVar51,
                 piVar48[*(int *)(new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_elements +
                                 uVar51 * 4)] ==
                 piVar48[*(int *)(new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_elements +
                                 uVar42 * 4)]))) {
            uVar51 = uVar51 + 1;
          }
          iVar31 = (int)uVar40;
          if (iVar31 - uVar50 != 1) goto code_r0x001e8428;
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&indegree.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                  (&vmap.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
        std::vector<int,_std::allocator<int>_>::vector
                  (&new_input_edge_id_set_lexicon.tmp_,
                   (long)(new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_buckets -
                         new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_elements) >> 2,
                   (allocator_type *)&vmap);
        for (lVar37 = 0;
            (long)(new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_buckets -
                  new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_elements) >> 2 != lVar37;
            lVar37 = lVar37 + 1) {
          new_input_edge_id_set_lexicon.tmp_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start
          [*(int *)(new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_elements + lVar37 * 4)] =
               (int)lVar37;
        }
        a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)vmap.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
        vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        b_input_edges.
        super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        b_edges.
        super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        b_input_edges.
        super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        b_input_edges.
        super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        b_edges.
        super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        b_edges.
        super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        piVar32 = *(int **)new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.key_info.
                           super_IdKeyEqual._0_8_;
        local_178 = &indegree;
        local_188 = "vector::_M_realloc_insert";
        local_344 = 0;
        local_208 = 0;
        local_158 = 0;
        CVar26 = (CrossingInputEdge)0x0;
        pCVar47 = (pointer)0x0;
        do {
          uVar40 = (ulong)local_344;
          if ((ulong)((long)(new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_buckets -
                            new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_elements) >> 2)
              <= uVar40) {
            std::
            vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
            ::~vector(&b_edges);
            std::
            vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
            ::~vector(&b_input_edges);
            std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                      ((_Bvector_base<std::allocator<bool>_> *)&vmap);
            options = (GraphOptions *)&a_num_crossings;
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)options);
            this_00 = &a_vertices.super__Vector_base<int,_std::allocator<int>_>;
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(this_00);
            GraphEdgeClipper::~GraphEdgeClipper((GraphEdgeClipper *)&new_input_edge_id_set_lexicon);
            if (s2builder_verbose == true) {
              poVar22 = std::operator<<((ostream *)&std::cout,"Edges after clipping: ");
              std::endl<char,std::char_traits<char>>(poVar22);
              for (uVar40 = 0; uVar40 < (ulong)((long)(local_248._8_8_ - local_248._0_8_) >> 3);
                  uVar40 = uVar40 + 1) {
                poVar22 = std::operator<<((ostream *)&std::cout,"  ");
                poVar22 = (ostream *)
                          std::ostream::operator<<(poVar22,((int *)local_248._32_8_)[uVar40]);
                poVar22 = std::operator<<(poVar22," (");
                poVar22 = (ostream *)
                          std::ostream::operator<<
                                    (poVar22,((pointer)(local_248._0_8_ + uVar40 * 8))->first);
                poVar22 = std::operator<<(poVar22,", ");
                poVar22 = (ostream *)
                          std::ostream::operator<<
                                    (poVar22,((pointer)(local_248._0_8_ + uVar40 * 8))->second);
                poVar22 = std::operator<<(poVar22,")");
                std::endl<char,std::char_traits<char>>(poVar22);
              }
            }
            IdSetLexicon::IdSetLexicon(&new_input_edge_id_set_lexicon);
            puVar4 = (this->layers_->
                     super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar37 = (long)(this->layers_->
                           super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3;
            if (lVar37 == 1) {
              (**(code **)(*(long *)(puVar4->_M_t).
                                    super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>
                                    ._M_t + 0x10))(&indegree);
              pSVar13 = local_210;
              MakeGraph((Graph *)&vmap,local_180,(GraphOptions *)&indegree,
                        (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        local_248,(vector<int,_std::allocator<int>_> *)(local_248 + 0x20),
                        &new_input_edge_id_set_lexicon,(S2Error *)local_210);
              _Var5._M_t.
              super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
              super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl =
                   (((this->layers_->
                     super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                   super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>.
                   _M_t;
              (**(code **)(*(long *)_Var5._M_t.
                                    super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                                    .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl +
                          0x18))(_Var5._M_t.
                                 super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                                 .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl,
                                 &vmap,pSVar13);
              std::_Function_base::~_Function_base(&local_1b0);
            }
            else {
              if (lVar37 != 3) {
                S2LogMessage::S2LogMessage
                          ((S2LogMessage *)&vmap,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                           ,0x30a,kFatal,(ostream *)&std::cerr);
                std::operator<<((ostream *)
                                vmap.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                "Check failed: (3) == (layers_.size()) ");
                goto LAB_001e9b40;
              }
              indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage = (pointer)0x0;
              indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._0_16_ = ZEXT816(0);
              a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              lVar37 = 0;
              do {
                *(undefined8 *)
                 ((long)&a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar37) = 0x200000000;
                *(undefined8 *)
                 ((long)&a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + lVar37) = 0x200000001;
                *(undefined1 *)
                 ((long)&a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + lVar37) = 1;
                lVar37 = lVar37 + 0x14;
              } while (lVar37 != 0x3c);
              b_input_edges.
              super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              b_input_edges.
              super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              b_input_edges.
              super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::reserve
                        ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)
                         &b_input_edges,3);
              lVar41 = 0;
              lVar37 = 0;
              for (uVar40 = 0; uVar40 < (ulong)((long)(local_248._8_8_ - local_248._0_8_) >> 3);
                  uVar40 = uVar40 + 1) {
                cVar2 = (this->input_dimensions_->
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                        super__Vector_impl_data._M_start[((int *)local_248._32_8_)[uVar40]];
                std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           (&indegree + cVar2),(value_type *)((long)(int *)local_248._0_8_ + lVar37)
                          );
                std::vector<int,_std::allocator<int>_>::push_back
                          (&a_vertices + cVar2,
                           (value_type_conflict2 *)((long)(int *)local_248._32_8_ + lVar41));
                lVar37 = lVar37 + 8;
                lVar41 = lVar41 + 4;
              }
              vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_248._0_8_;
              vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_248._8_8_;
              vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_248._16_8_;
              local_248._0_8_ = (pointer)0x0;
              local_248._8_8_ = (pointer)0x0;
              local_248._16_8_ = (pointer)0x0;
              std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
              ~_Vector_base((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             *)&vmap);
              vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_248._32_8_;
              vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_248._40_8_;
              vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = local_218;
              local_248._32_8_ = (pointer)0x0;
              local_248._40_8_ = (pointer)0x0;
              local_218 = (pointer)0x0;
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&vmap);
              lVar37 = 0;
              for (lVar41 = 0; lVar41 != 3; lVar41 = lVar41 + 1) {
                (**(code **)(*(long *)(this->layers_->
                                      super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[lVar41]._M_t.
                                      super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>
                                      ._M_t + 0x10))((Graph *)&vmap);
                options->allow_vertex_filtering_ =
                     vmap.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_;
                *(pointer *)options =
                     vmap.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                *(pointer *)&options->duplicate_edges_ =
                     vmap.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                MakeGraph((Graph *)&vmap,local_180,options,
                          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          local_178,(vector<int,_std::allocator<int>_> *)this_00,
                          &new_input_edge_id_set_lexicon,(S2Error *)local_210);
                std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::
                emplace_back<S2Builder::Graph>
                          ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)
                           &b_input_edges,(Graph *)&vmap);
                std::_Function_base::~_Function_base(&local_1b0);
                _Var5._M_t.
                super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>.
                super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl =
                     (this->layers_->
                     super__Vector_base<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar41]._M_t.
                     super___uniq_ptr_impl<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>
                     ._M_t;
                (**(code **)(*(long *)_Var5._M_t.
                                      super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                                      .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl
                            + 0x18))
                          (_Var5._M_t.
                           super__Tuple_impl<0UL,_S2Builder::Layer_*,_std::default_delete<S2Builder::Layer>_>
                           .super__Head_base<0UL,_S2Builder::Layer_*,_false>._M_head_impl,
                           &(b_input_edges.
                             super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                             ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar37,
                           local_210);
                this_00 = this_00 + 1;
                local_178 = local_178 + 1;
                options = options + 1;
                lVar37 = lVar37 + 0x68;
              }
              std::vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_>::~vector
                        ((vector<S2Builder::Graph,_std::allocator<S2Builder::Graph>_> *)
                         &b_input_edges);
              lVar37 = 0x30;
              do {
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          ((_Vector_base<int,_std::allocator<int>_> *)
                           ((long)&a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar37));
                lVar37 = lVar37 + -0x18;
              } while (lVar37 != -0x18);
              lVar37 = 0x30;
              do {
                std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                ~_Vector_base((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               *)((long)&indegree.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start + lVar37));
                lVar37 = lVar37 + -0x18;
              } while (lVar37 != -0x18);
            }
            IdSetLexicon::~IdSetLexicon(&new_input_edge_id_set_lexicon);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)(local_248 + 0x20));
            std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
            ~_Vector_base((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           *)local_248);
            return;
          }
          lVar41 = (long)*(int *)(new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_elements +
                                 uVar40 * 4);
          iVar31 = *(int *)(*(long *)new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_deleted
                           + lVar41 * 4);
          lVar37 = (long)iVar31;
          __x = (Edge *)(lVar41 * 8 +
                        **(long **)(new_input_edge_id_set_lexicon.id_sets_.values_.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + 8));
          pCVar35 = pCVar47;
          b_input_edges.
          super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
          ._M_impl.super__Vector_impl_data._M_finish = pCVar47;
          for (; (pCVar18 = b_input_edges.
                            super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 piVar32 !=
                 *(int **)(new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.key_info.
                           super_IdKeyEqual._0_8_ + 8) && (*piVar32 == iVar31));
              piVar32 = piVar32 + 2) {
            CVar45 = *(CrossingInputEdge *)(piVar32 + 1);
            iVar25 = (int)CVar45 >> 1;
            uVar27 = local_208;
            CVar8 = CVar26;
            if (iVar25 < 0) {
              uVar42 = (ulong)(uint)CVar45;
              if (((iVar25 != -2) && (uVar42 = local_158, CVar8 = CVar45, iVar25 != -1)) &&
                 (uVar27 = (ulong)(uint)CVar45, CVar8 = CVar26, iVar25 != -3)) {
                S2LogMessage::S2LogMessage
                          ((S2LogMessage *)&indegree,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                           ,0x165,kFatal,(ostream *)&std::cerr);
                std::operator<<((ostream *)
                                indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,
                                "Check failed: (next->second.input_id()) == (kSetReverseA) ");
                goto LAB_001e9b40;
              }
            }
            else if (pCVar47 ==
                     b_input_edges.
                     super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              if ((long)pCVar47 - (long)pCVar35 == 0x7ffffffffffffffc) {
LAB_001e9d6a:
                std::__throw_length_error(local_188);
              }
              uVar42 = (long)pCVar47 - (long)pCVar35 >> 2;
              uVar27 = uVar42;
              if (pCVar47 == pCVar35) {
                uVar27 = 1;
              }
              uVar51 = uVar27 + uVar42;
              if (0x1ffffffffffffffe < uVar51) {
                uVar51 = 0x1fffffffffffffff;
              }
              if (CARRY8(uVar27,uVar42)) {
                uVar51 = 0x1fffffffffffffff;
              }
              if (uVar51 == 0) {
                pCVar17 = (CrossingInputEdge *)0x0;
              }
              else {
                pCVar17 = (CrossingInputEdge *)operator_new(uVar51 * 4);
                CVar45 = *(CrossingInputEdge *)(piVar32 + 1);
              }
              pCVar17[uVar42] = CVar45;
              pCVar7 = pCVar17;
              for (pCVar18 = pCVar35; pCVar46 = pCVar7 + 1, pCVar18 != pCVar47;
                  pCVar18 = pCVar18 + 1) {
                *pCVar7 = *pCVar18;
                pCVar7 = pCVar46;
              }
              if (pCVar35 != (pointer)0x0) {
                operator_delete(pCVar35);
              }
              b_input_edges.
              super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar17 + uVar51;
              pCVar35 = pCVar17;
              pCVar47 = pCVar46;
              b_input_edges.
              super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
              ._M_impl.super__Vector_impl_data._M_start = pCVar17;
              b_input_edges.
              super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
              ._M_impl.super__Vector_impl_data._M_finish = pCVar46;
              uVar27 = local_208;
              uVar42 = local_158;
            }
            else {
              *pCVar47 = CVar45;
              pCVar47 = pCVar47 + 1;
              b_input_edges.
              super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
              ._M_impl.super__Vector_impl_data._M_finish = pCVar47;
              uVar42 = local_158;
            }
            local_158 = uVar42;
            local_208 = uVar27;
            CVar26 = CVar8;
          }
          bVar14 = CVar26._0_1_;
          if (__x->first == __x->second) {
            GraphEdgeClipper::AddEdge
                      ((GraphEdgeClipper *)&new_input_edge_id_set_lexicon,*__x,iVar31);
            CVar26._1_3_ = 0;
            CVar26._0_1_ = ((uint)((int)pCVar47 - (int)pCVar18) >> 2 & 1) != (uint)(bVar14 & 1);
          }
          else if (b_input_edges.
                   super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                   ._M_impl.super__Vector_impl_data._M_start == pCVar47) {
            if (((uint)CVar26 & 1) != 0) {
              if ((local_208 & 1) == 0) {
                edge = *__x;
              }
              else {
                edge.second = __x->first;
                edge.first = __x->second;
              }
              GraphEdgeClipper::AddEdge
                        ((GraphEdgeClipper *)&new_input_edge_id_set_lexicon,edge,iVar31);
            }
          }
          else {
            if (a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            std::vector<int,_std::allocator<int>_>::push_back
                      (&a_vertices,(value_type_conflict2 *)__x);
            std::
            vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
            ::_M_erase_at_end(&b_edges,b_edges.
                                       super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            pIVar12 = b_edges.
                      super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pIVar43 = b_edges.
                      super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar42 = (long)pCVar47 - (long)pCVar18 >> 2;
            lVar52 = (long)b_edges.
                           super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)b_edges.
                           super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            uVar27 = lVar52 / 0x28;
            lVar41 = uVar27 - uVar42;
            if (uVar42 <= uVar27) {
              if (uVar42 <= uVar27 && lVar41 != 0) {
                std::
                vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                ::_M_erase_at_end(&b_edges,b_edges.
                                           super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar42);
              }
            }
            else {
              uVar51 = uVar42 - uVar27;
              if (uVar51 != 0) {
                if ((ulong)(((long)b_edges.
                                   super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)b_edges.
                                  super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish) / 0x28) < uVar51) {
                  if (0x333333333333333 - uVar27 < uVar51) {
                    local_188 = "vector::_M_default_append";
                    goto LAB_001e9d6a;
                  }
                  uVar19 = uVar51;
                  if (uVar51 < uVar27) {
                    uVar19 = uVar27;
                  }
                  uVar19 = uVar19 + uVar27;
                  if (0x333333333333332 < uVar19) {
                    uVar19 = 0x333333333333333;
                  }
                  pIVar20 = (pointer)operator_new(uVar19 * 0x28);
                  puVar53 = (undefined8 *)(lVar52 + (long)pIVar20);
                  puVar21 = puVar53;
                  for (lVar41 = uVar27 - uVar42; pIVar33 = pIVar20, lVar41 != 0; lVar41 = lVar41 + 1
                      ) {
                    *puVar21 = 0;
                    puVar21 = puVar21 + 5;
                  }
                  for (; pIVar43 != pIVar12; pIVar43 = pIVar43 + 1) {
                    uVar27 = (pIVar43->allocator_and_tag_).tag_.size_;
                    (pIVar33->allocator_and_tag_).tag_.size_ = uVar27;
                    if ((uVar27 & 1) == 0) {
                      for (lVar41 = 0; uVar27 << 3 != lVar41; lVar41 = lVar41 + 0x10) {
                        uVar11 = *(undefined8 *)((long)&pIVar43->rep_ + lVar41 + 8);
                        *(undefined8 *)((long)&pIVar33->rep_ + lVar41) =
                             *(undefined8 *)((long)&pIVar43->rep_ + lVar41);
                        *(undefined8 *)((long)&pIVar33->rep_ + lVar41 + 8) = uVar11;
                      }
                    }
                    else {
                      uVar11 = *(undefined8 *)((long)&pIVar43->rep_ + 8);
                      *(undefined8 *)&pIVar33->rep_ = *(undefined8 *)&pIVar43->rep_;
                      *(undefined8 *)((long)&pIVar33->rep_ + 8) = uVar11;
                      (pIVar43->allocator_and_tag_).tag_.size_ = 0;
                    }
                    absl::
                    InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                    ::~InlinedVector(pIVar43);
                    pIVar33 = pIVar33 + 1;
                  }
                  if (b_edges.
                      super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(b_edges.
                                    super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  b_edges.
                  super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(puVar53 + uVar51 * 5);
                  b_edges.
                  super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = pIVar20 + uVar19;
                  b_edges.
                  super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = pIVar20;
                }
                else {
                  for (; lVar41 != 0; lVar41 = lVar41 + 1) {
                    ((b_edges.
                      super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->allocator_and_tag_).tag_.size_ =
                         0;
                    b_edges.
                    super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         b_edges.
                         super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                }
              }
            }
            GraphEdgeClipper::GatherIncidentEdges
                      ((GraphEdgeClipper *)&new_input_edge_id_set_lexicon,&a_vertices,0,
                       &b_input_edges,&b_edges);
            local_344 = local_344 + -1;
            while ((uVar40 < (ulong)((long)(new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.
                                            num_buckets -
                                           new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.
                                           num_elements) >> 2) &&
                   (lVar41 = (long)*(int *)(new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.
                                            num_elements + uVar40 * 4),
                   *(int *)(*(long *)new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_deleted
                           + lVar41 * 4) == iVar31))) {
              std::vector<int,_std::allocator<int>_>::push_back
                        (&a_vertices,
                         (value_type_conflict2 *)
                         (**(long **)(new_input_edge_id_set_lexicon.id_sets_.values_.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + 8) + lVar41 * 8 + 4));
              GraphEdgeClipper::GatherIncidentEdges
                        ((GraphEdgeClipper *)&new_input_edge_id_set_lexicon,&a_vertices,
                         (int)((ulong)((long)a_vertices.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish -
                                      (long)a_vertices.super__Vector_base<int,_std::allocator<int>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2) + -1,
                         &b_input_edges,&b_edges);
              uVar40 = uVar40 + 1;
              local_344 = local_344 + 1;
            }
            if (s2builder_verbose == true) {
              poVar22 = std::operator<<((ostream *)&std::cout,"input edge ");
              poVar22 = (ostream *)std::ostream::operator<<(poVar22,iVar31);
              poVar22 = std::operator<<(poVar22," (inside=");
              poVar22 = std::ostream::_M_insert<bool>(SUB81(poVar22,0));
              std::operator<<(poVar22,"):");
              piVar28 = a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              for (piVar48 = a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start; piVar48 != piVar28;
                  piVar48 = piVar48 + 1) {
                iVar31 = *piVar48;
                poVar22 = std::operator<<((ostream *)&std::cout," ");
                std::ostream::operator<<(poVar22,iVar31);
              }
            }
            if (a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            std::vector<int,_std::allocator<int>_>::resize
                      (&a_num_crossings,
                       (long)a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2);
            vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            uVar40 = (long)a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            std::vector<bool,_std::allocator<bool>_>::resize
                      ((vector<bool,_std::allocator<bool>_> *)&vmap,uVar40,false);
            pIVar43 = b_edges.
                      super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pCVar18 = b_input_edges.
                      super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar52 = (long)pCVar47 -
                     (long)b_input_edges.
                           super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            local_170 = lVar37;
            for (lVar41 = 0; lVar41 != lVar52 >> 2; lVar41 = lVar41 + 1) {
              if (a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                S2LogMessage::S2LogMessage
                          ((S2LogMessage *)&indegree,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                           ,0x218,kFatal,(ostream *)&std::cerr);
                std::operator<<((ostream *)
                                indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,"Check failed: !a.empty() ");
                goto LAB_001e9b40;
              }
              pIVar36 = pIVar43 + lVar41;
              if ((pIVar36->allocator_and_tag_).tag_.size_ < 2) {
                S2LogMessage::S2LogMessage
                          ((S2LogMessage *)&indegree,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                           ,0x219,kFatal,(ostream *)&std::cerr);
                std::operator<<((ostream *)
                                indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,"Check failed: !b.empty() ");
                goto LAB_001e9b40;
              }
              bVar1 = *(byte *)(pCVar18 + lVar41);
              uVar27 = (long)a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
              uVar50 = 0;
              iVar31 = (int)(uVar27 >> 2);
              local_150 = lVar41;
              if (iVar31 != 1) {
                pCVar23 = absl::
                          InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                          ::operator[](pIVar36,uVar40);
                iVar25 = pCVar23->a_index;
                pCVar23 = absl::
                          InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                          ::back(pIVar36);
                iVar3 = pCVar23->a_index;
                pCVar23 = absl::
                          InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                          ::operator[](pIVar36,uVar40);
                if (iVar25 == iVar3) {
                  uVar50 = pCVar23->a_index;
                }
                else {
                  iVar25 = (pCVar23->outgoing ^ 1) +
                           new_input_edge_id_set_lexicon.tmp_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[pCVar23->id];
                  pCVar23 = absl::
                            InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                            ::back(pIVar36);
                  local_200 = (pCVar23->outgoing ^ 1) +
                              new_input_edge_id_set_lexicon.tmp_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[pCVar23->id];
                  bVar54 = local_200 < iVar25;
                  uVar40 = (pIVar36->allocator_and_tag_).tag_.size_;
                  pRVar49 = &pIVar36->rep_;
                  pRVar30 = pRVar49;
                  if ((uVar40 & 1) != 0) {
                    pRVar30 = *(Rep **)((long)&pIVar36->rep_ + 8);
                  }
                  local_340 = new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_buckets -
                              new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_elements >> 2;
                  lVar41 = (uVar40 & 0x1ffffffffffffffe) << 3;
                  local_36c = -1;
                  uVar50 = 0xffffffff;
                  uVar29 = 0xffffffff;
                  piVar28 = new_input_edge_id_set_lexicon.tmp_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  local_1fc = iVar25;
                  local_168 = lVar41;
                  local_160 = pIVar36;
                  for (lVar44 = 0; iVar25 = (int)local_340, lVar41 != lVar44; lVar44 = lVar44 + 0x10
                      ) {
                    iVar3 = *(int *)((long)pRVar30 + lVar44 + 4);
                    lVar24 = (long)iVar3;
                    if (lVar24 == 0) {
                      if (((bool)*(char *)((long)pRVar30 + lVar44 + 8) != bVar54) &&
                         (*(int *)((long)pRVar30 + lVar44 + 0xc) !=
                          a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[1])) {
                        uVar29 = *(uint *)((long)pRVar30 + lVar44);
                      }
                    }
                    else if (iVar3 == iVar31 + -1) {
                      if (((bool)*(char *)((long)pRVar30 + lVar44 + 8) == bVar54) &&
                         (*(int *)((long)pRVar30 + lVar44 + 0xc) !=
                          *(int *)((long)a_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start +
                                  ((long)(uVar27 * 0x40000000 + -0x200000000) >> 0x1e)))) {
                        uVar50 = *(uint *)((long)pRVar30 + lVar44);
                      }
                    }
                    else {
                      iVar3 = *(int *)((long)pRVar30 + lVar44 + 0xc);
                      if ((iVar3 != a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start[lVar24 + -1]) &&
                         (iVar3 != a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar24 + 1])) {
                        lVar37 = **(long **)(new_input_edge_id_set_lexicon.id_sets_.values_.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start + 6);
                        bVar15 = s2pred::OrderedCCW((S2Point *)
                                                    ((long)a_vertices.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [lVar24 + 1] * 0x18 + lVar37),
                                                  (S2Point *)((long)iVar3 * 0x18 + lVar37),
                                                  (S2Point *)
                                                  ((long)a_vertices.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [lVar24 + -1] * 0x18 + lVar37),
                                                  (S2Point *)
                                                  ((long)a_vertices.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[lVar24] *
                                                  0x18 + lVar37));
                        uVar38 = new_input_edge_id_set_lexicon.tmp_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[*(int *)((long)pRVar30 + lVar44)];
                        piVar28 = new_input_edge_id_set_lexicon.tmp_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        pIVar36 = local_160;
                        lVar37 = local_170;
                        lVar41 = local_168;
                        if (((bVar15 ^ bVar1) & 1) == 0) {
                          if (local_36c <= (int)(uVar38 + 1)) {
                            local_36c = uVar38 + 1;
                          }
                        }
                        else {
                          local_340 = local_340 & 0xffffffff;
                          if ((int)uVar38 < iVar25) {
                            local_340 = (ulong)uVar38;
                          }
                        }
                      }
                    }
                  }
                  if ((-1 < (int)uVar29) && (-1 < (int)uVar50)) {
                    uVar40 = (pIVar36->allocator_and_tag_).tag_.size_;
                    pRVar30 = pRVar49;
                    if ((uVar40 & 1) != 0) {
                      pRVar30 = *(Rep **)((long)&pIVar36->rep_ + 8);
                    }
                    uVar27 = new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_buckets -
                             new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_elements >> 2;
                    uVar38 = 0xffffffff;
                    for (lVar41 = (uVar40 & 0x1ffffffffffffffe) << 3; iVar31 = (int)uVar27,
                        lVar41 != 0; lVar41 = lVar41 + -0x10) {
                      uVar39 = (*(byte *)((long)pRVar30 + 8) ^ 1) + piVar28[*(int *)pRVar30];
                      uVar27 = uVar27 & 0xffffffff;
                      if ((int)uVar39 < iVar31) {
                        uVar27 = (ulong)uVar39;
                      }
                      if ((int)uVar38 <= (int)uVar39) {
                        uVar38 = uVar39;
                      }
                      pRVar30 = (Rep *)((long)pRVar30 + 0x10);
                    }
                    if ((local_36c <= iVar31) && ((int)uVar38 <= iVar25)) {
                      uVar38 = uVar50;
                      if (local_200 < local_1fc) {
                        uVar38 = uVar29;
                      }
                      uVar40 = (ulong)uVar38;
                      if (local_200 < local_1fc) {
                        uVar29 = uVar50;
                      }
                      indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._0_16_ = ZEXT816(0);
                      indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      lVar41 = (long)piVar28[uVar29];
                      for (; lVar41 < piVar28[uVar40]; lVar41 = lVar41 + 1) {
                        std::vector<int,_std::allocator<int>_>::push_back
                                  (&indegree,
                                   (value_type_conflict2 *)
                                   (**(long **)(new_input_edge_id_set_lexicon.id_sets_.values_.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start + 8) +
                                    (long)*(int *)(new_input_edge_id_set_lexicon.id_sets_.id_set_.
                                                   rep.num_elements + lVar41 * 4) * 8 + 4));
                        piVar28 = new_input_edge_id_set_lexicon.tmp_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                      }
                      if (*(int *)(**(long **)(new_input_edge_id_set_lexicon.id_sets_.values_.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start + 8) + 4 +
                                  uVar40 * 8) !=
                          *a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) {
                        std::
                        __reverse<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                                  (indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
                      }
                      std::vector<int,std::allocator<int>>::
                      insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                                ((vector<int,std::allocator<int>> *)&indegree,
                                 (const_iterator)
                                 indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,
                                 (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                  )a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start,
                                 (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                  )a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish);
                      for (lVar41 = 0; lVar41 != 8; lVar41 = lVar41 + 4) {
                        std::vector<int,_std::allocator<int>_>::insert
                                  (&indegree,
                                   (const_iterator)
                                   indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish,
                                   (value_type_conflict2 *)
                                   ((long)indegree.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start + lVar41));
                      }
                      dVar55 = 0.0;
                      uVar27 = 2;
                      while( true ) {
                        if ((ulong)((long)indegree.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)indegree.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar27)
                        break;
                        lVar41 = **(long **)(new_input_edge_id_set_lexicon.id_sets_.values_.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start + 6);
                        dVar6 = S2::TurnAngle((S2Point *)
                                              ((long)indegree.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [uVar27 - 2] * 0x18 + lVar41),
                                              (S2Point *)
                                              ((long)indegree.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [uVar27 - 1] * 0x18 + lVar41),
                                              (S2Point *)
                                              ((long)indegree.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar27] *
                                               0x18 + lVar41));
                        dVar55 = dVar55 + dVar6;
                        uVar27 = uVar27 + 1;
                      }
                      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                                (&indegree.super__Vector_base<int,_std::allocator<int>_>);
                      piVar28 = new_input_edge_id_set_lexicon.tmp_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      if (((0.0 < dVar55 ^ bVar1) & 1) == 0) {
                        if (local_36c <=
                            new_input_edge_id_set_lexicon.tmp_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar40] + 1) {
                          local_36c = new_input_edge_id_set_lexicon.tmp_.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[uVar40] + 1;
                        }
                      }
                      else if (new_input_edge_id_set_lexicon.tmp_.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar29] < iVar25) {
                        iVar25 = new_input_edge_id_set_lexicon.tmp_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar29];
                      }
                    }
                  }
                  if (iVar25 < local_36c) {
                    S2LogMessage::S2LogMessage
                              ((S2LogMessage *)&indegree,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                               ,0x293,kFatal,(ostream *)&std::cerr);
                    std::operator<<((ostream *)
                                    indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish,"Check failed: (lo) <= (hi) ")
                    ;
                    goto LAB_001e9b40;
                  }
                  uVar40 = (pIVar36->allocator_and_tag_).tag_.size_;
                  if ((uVar40 & 1) != 0) {
                    pRVar49 = *(Rep **)((long)&pIVar36->rep_ + 8);
                  }
                  uVar50 = 0xffffffff;
                  for (lVar41 = (uVar40 & 0x1ffffffffffffffe) << 3; lVar41 != 0;
                      lVar41 = lVar41 + -0x10) {
                    iVar31 = (*(byte *)((long)pRVar49 + 8) ^ 1) + piVar28[*(int *)pRVar49];
                    if (((local_36c <= iVar31) && (iVar31 <= iVar25)) &&
                       (((int)uVar50 < 0 ||
                        (a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)*(uint *)((long)pRVar49 + 4)] <
                         a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar50])))) {
                      uVar50 = *(uint *)((long)pRVar49 + 4);
                    }
                    pRVar49 = (Rep *)((long)pRVar49 + 0x10);
                  }
                }
                if ((int)uVar50 < 0) {
                  S2LogMessage::S2LogMessage
                            ((S2LogMessage *)&indegree,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                             ,0x1ba,kFatal,(ostream *)&std::cerr);
                  std::operator<<((ostream *)
                                  indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish,
                                  "Failed to get crossed vertex index.");
                  goto LAB_001e9b40;
                }
              }
              lVar41 = local_150;
              uVar40 = (ulong)uVar50;
              if (s2builder_verbose != false) {
                poVar22 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                poVar22 = std::operator<<(poVar22,"  ");
                poVar22 = std::operator<<(poVar22,"b input edge ");
                poVar22 = (ostream *)std::ostream::operator<<(poVar22,(int)pCVar18[lVar41] >> 1);
                poVar22 = std::operator<<(poVar22," (l2r=");
                poVar22 = std::ostream::_M_insert<bool>(SUB81(poVar22,0));
                poVar22 = std::operator<<(poVar22,", crossing=");
                poVar22 = (ostream *)
                          std::ostream::operator<<
                                    (poVar22,a_vertices.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[uVar40]);
                std::operator<<(poVar22,")");
                uVar27 = (pIVar36->allocator_and_tag_).tag_.size_;
                if ((uVar27 & 1) == 0) {
                  pRVar49 = &pIVar36->rep_;
                }
                else {
                  pRVar49 = *(Rep **)((long)&pIVar36->rep_ + 8);
                }
                for (lVar41 = 0; (uVar27 & 0x1ffffffffffffffe) * 8 != lVar41; lVar41 = lVar41 + 0x10
                    ) {
                  iVar31 = *(int *)((long)pRVar49 + lVar41);
                  lVar44 = **(long **)(new_input_edge_id_set_lexicon.id_sets_.values_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start + 8);
                  poVar22 = std::operator<<((ostream *)&std::cout," (");
                  poVar22 = (ostream *)
                            std::ostream::operator<<(poVar22,*(int *)(lVar44 + (long)iVar31 * 8));
                  poVar22 = std::operator<<(poVar22,", ");
                  poVar22 = (ostream *)
                            std::ostream::operator<<
                                      (poVar22,*(int *)(lVar44 + 4 + (long)iVar31 * 8));
                  std::operator<<(poVar22,")");
                }
              }
              lVar41 = local_150;
              uVar50 = ((bVar1 ^ (byte)local_158) & 1) - 1 | 1;
              if (*(char *)(*(long *)new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.settings.
                                     super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
                                     ._40_8_ + (long)((int)pCVar18[local_150] >> 1)) == '\x01') {
                uVar50 = 0;
              }
              a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar40] =
                   a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar40] + uVar50;
              rVar56 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)&vmap,uVar40);
              *rVar56._M_p = *rVar56._M_p | rVar56._M_mask;
            }
            if (s2builder_verbose != false) {
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            }
            CVar26 = (CrossingInputEdge)
                     ((uint)(bVar14 & 1) +
                     *a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
            for (uVar40 = 1; input_edge_id = (InputEdgeId)lVar37,
                uVar40 < (ulong)((long)a_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)a_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 2);
                uVar40 = uVar40 + 1) {
              if (CVar26 != (CrossingInputEdge)0x0) {
                indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._0_16_ =
                     std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&vmap,uVar40);
                *indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start =
                     *indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start &
                     ~indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
                local_40 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     ((vector<bool,_std::allocator<bool>_> *)&vmap,uVar40 - 1);
                std::_Bit_reference::operator=(&local_40,(_Bit_reference *)&indegree);
              }
              CVar45 = (CrossingInputEdge)-(int)CVar26;
              if ((local_208 & 1) == 0) {
                CVar45 = CVar26;
              }
              CVar8 = (CrossingInputEdge)0x0;
              CVar34 = (CrossingInputEdge)0x0;
              if (0 < (int)CVar45) {
                CVar8 = CVar45;
                CVar34 = CVar45;
              }
              while (CVar8 != (CrossingInputEdge)0x0) {
                GraphEdgeClipper::AddEdge
                          ((GraphEdgeClipper *)&new_input_edge_id_set_lexicon,
                           *(Edge *)(a_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start + (uVar40 - 1)),
                           input_edge_id);
                CVar8 = (CrossingInputEdge)((int)CVar8 - 1);
              }
              iVar31 = (int)CVar34 - (int)CVar45;
              while (bVar54 = iVar31 != 0, iVar31 = iVar31 + -1, bVar54) {
                edge_00.second =
                     a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar40 - 1];
                edge_00.first =
                     a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar40];
                GraphEdgeClipper::AddEdge
                          ((GraphEdgeClipper *)&new_input_edge_id_set_lexicon,edge_00,input_edge_id)
                ;
              }
              CVar26 = (CrossingInputEdge)
                       ((int)CVar26 +
                       a_num_crossings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar40]);
            }
            if (1 < (uint)CVar26) {
              S2LogMessage::S2LogMessage
                        ((S2LogMessage *)&indegree,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                         ,0x1d6,kFatal,(ostream *)&std::cerr);
              std::operator<<((ostream *)
                              indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish,
                              "Check failed: multiplicity == 0 || multiplicity == 1 ");
              goto LAB_001e9b40;
            }
            if (*(char *)(*(long *)new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.settings.
                                   super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
                                   ._40_8_ + lVar37) != '\0') {
              for (uVar40 = 0;
                  uVar40 < (ulong)((long)a_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)a_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 2);
                  uVar40 = uVar40 + 1) {
                rVar56 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)&vmap,uVar40);
                if ((*rVar56._M_p & rVar56._M_mask) != 0) {
                  edge_01.second =
                       a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar40];
                  edge_01.first =
                       a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar40];
                  GraphEdgeClipper::AddEdge
                            ((GraphEdgeClipper *)&new_input_edge_id_set_lexicon,edge_01,
                             input_edge_id);
                }
              }
            }
          }
          local_344 = local_344 + 1;
          pCVar47 = pCVar18;
        } while( true );
      }
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&vmap,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                 ,0xc1,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)
                      vmap.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                      "Check failed: g.options().sibling_pairs() == SiblingPairs::KEEP ");
    }
    else {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&vmap,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                 ,0xc0,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)
                      vmap.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                      "Check failed: g.options().duplicate_edges() == DuplicateEdges::KEEP ");
    }
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&vmap,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0xbf,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)
                    vmap.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
                    "Check failed: g.options().edge_type() == EdgeType::DIRECTED ");
  }
LAB_001e9b40:
  abort();
code_r0x001e8428:
  for (uVar27 = uVar42; (long)uVar27 < (long)iVar31; uVar27 = uVar27 + 1) {
    iVar25 = *(int *)(new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_elements + uVar27 * 4);
    a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(iVar25,*(undefined4 *)(**(long **)(piVar28 + 8) + (long)iVar25 * 8)
                                );
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&vmap,
               (pair<int,_int> *)&a_vertices);
    indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [*(int *)(**(long **)(piVar28 + 8) + 4 + (long)iVar25 * 8)] =
         indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[*(int *)(**(long **)(piVar28 + 8) + 4 + (long)iVar25 * 8)] + 1;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  lVar37 = **(long **)(piVar28 + 8);
  uVar51 = (ulong)((*(long **)(piVar28 + 8))[1] - lVar37) >> 3;
  for (uVar27 = uVar42; (long)uVar27 < (long)iVar31; uVar27 = uVar27 + 1) {
    uVar29 = *(uint *)(new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_elements + uVar27 * 4)
    ;
    uVar51 = uVar51 & 0xffffffff;
    if (indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[*(int *)(lVar37 + (long)(int)uVar29 * 8)] == 0) {
      uVar51 = (ulong)uVar29;
    }
  }
  iVar31 = ~uVar50 + iVar31;
  while( true ) {
    *(int *)(new_input_edge_id_set_lexicon.id_sets_.id_set_.rep.num_elements + uVar42 * 4) =
         (int)uVar51;
    uVar50 = *(uint *)(lVar37 + 4 + (long)(int)uVar51 * 8);
    indegree.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [(int)uVar50] = 0;
    bVar54 = iVar31 == 0;
    iVar31 = iVar31 + -1;
    if (bVar54) break;
    a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(ulong)uVar50;
    _Var16 = std::
             __lower_bound<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val>
                       (vmap.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        vmap.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&a_vertices);
    if (uVar50 != (_Var16._M_current)->first) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&a_vertices,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                 ,0xeb,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)
                      a_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,"Check failed: (v) == (out->first) ");
      goto LAB_001e9b40;
    }
    uVar51 = (ulong)(uint)(_Var16._M_current)->second;
    lVar37 = **(long **)(piVar28 + 8);
    uVar42 = uVar42 + 1;
  }
  if (vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         vmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
         .super__Vector_impl_data._M_start;
  }
  goto LAB_001e83dc;
}

Assistant:

void EdgeClippingLayer::Build(const Graph& g, S2Error* error) {
  // The bulk of the work is handled by GraphEdgeClipper.
  vector<Graph::Edge> new_edges;
  vector<InputEdgeIdSetId> new_input_edge_ids;
  // Destroy the GraphEdgeClipper immediately to save memory.
  GraphEdgeClipper(g, input_dimensions_, input_crossings_,
                   &new_edges, &new_input_edge_ids).Run();
  if (s2builder_verbose) {
    std::cout << "Edges after clipping: " << std::endl;
    for (int i = 0; i < new_edges.size(); ++i) {
      std::cout << "  " << new_input_edge_ids[i] << " (" << new_edges[i].first
                << ", " << new_edges[i].second << ")" << std::endl;
    }
  }
  // Construct one or more graphs from the clipped edges and pass them to the
  // given output layer(s).
  IdSetLexicon new_input_edge_id_set_lexicon;
  if (layers_.size() == 1) {
    GraphOptions options = layers_[0]->graph_options();
    Graph new_graph = MakeGraph(g, &options, &new_edges, &new_input_edge_ids,
                                &new_input_edge_id_set_lexicon, error);
    layers_[0]->Build(new_graph, error);
  } else {
    // The Graph objects must be valid until the last Build() call completes,
    // so we store all of the graph data in arrays with 3 elements.
    S2_DCHECK_EQ(3, layers_.size());
    vector<Graph::Edge> layer_edges[3];
    vector<InputEdgeIdSetId> layer_input_edge_ids[3];
    S2Builder::GraphOptions layer_options[3];
    vector<S2Builder::Graph> layer_graphs;  // No default constructor.
    layer_graphs.reserve(3);
    // Separate the edges according to their dimension.
    for (int i = 0; i < new_edges.size(); ++i) {
      int d = input_dimensions_[new_input_edge_ids[i]];
      layer_edges[d].push_back(new_edges[i]);
      layer_input_edge_ids[d].push_back(new_input_edge_ids[i]);
    }
    // Clear variables to save space.
    vector<Graph::Edge>().swap(new_edges);
    vector<InputEdgeIdSetId>().swap(new_input_edge_ids);
    for (int d = 0; d < 3; ++d) {
      layer_options[d] = layers_[d]->graph_options();
      layer_graphs.push_back(MakeGraph(
          g, &layer_options[d], &layer_edges[d], &layer_input_edge_ids[d],
          &new_input_edge_id_set_lexicon, error));
      layers_[d]->Build(layer_graphs[d], error);
    }
  }
}